

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * ot::commissioner::coap::Message::Deserialize
                  (Error *__return_storage_ptr__,OptionType *aOptionNumber,OptionValue *aOptionValue
                  ,uint16_t aLastOptionNumber,ByteArray *aBuf,size_t *aOffset)

{
  byte bVar1;
  char cVar2;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar3;
  pointer puVar4;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *paVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  char *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar9;
  long lVar10;
  size_t __n;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  ushort uVar11;
  byte bVar12;
  ushort uVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar14;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar15;
  long lVar16;
  ulong uVar17;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  writer write;
  string local_c0;
  writer local_a0;
  ErrorCode local_98 [2];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  ulong local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_70 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_70;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pvVar3 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)*aOffset;
  puVar4 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar9 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
           ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish + -(long)puVar4);
  if (pvVar3 < pvVar9) {
    bVar1 = *(byte *)((long)&pvVar3->field_0 + (long)puVar4);
    uVar13 = bVar1 & 0xf;
    lVar16 = 1;
    if (0xcf < bVar1) {
      lVar16 = 3 - (ulong)(bVar1 < 0xe0);
    }
    bVar12 = (byte)uVar13;
    lVar10 = 0;
    if (0xc < bVar12) {
      lVar10 = (ulong)(uVar13 != 0xd) + 1;
    }
    aVar14.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
         ((long)&pvVar3->field_0 + lVar10 + lVar16);
    if (pvVar9 < aVar14.values_) {
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of a CoAP option";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      pcVar7 = "premature end of a CoAP option";
      local_68.context_.types_ = local_68.types_;
      do {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",&local_68);
        }
        pcVar7 = pcVar6;
      } while (pcVar6 != "");
      args.field_1.values_ = aVar14.values_;
      args.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),args);
      local_98[0] = kBadFormat;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
    }
    else {
      uVar11 = (ushort)(bVar1 >> 4);
      if (0xcf < bVar1) {
        if (uVar11 == 0xe) {
          uVar11 = *(ushort *)((long)&pvVar3->field_0 + (long)(puVar4 + 1));
          uVar11 = (uVar11 << 8 | uVar11 >> 8) + 0x10d;
          pvVar15 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                    ((long)&pvVar3->field_0 + 3);
          goto LAB_001f40eb;
        }
        if (uVar11 == 0xd) {
          pvVar15 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                    ((long)&pvVar3->field_0 + 2);
          uVar11 = *(byte *)((long)&pvVar3->field_0 + (long)(puVar4 + 1)) + 0xd;
          goto LAB_001f40eb;
        }
        if (bVar12 == 0xf) {
          local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
          local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "cannot find more CoAP option";
          local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1c;
          local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
          local_68.parse_funcs_[0] = (parse_func)0x0;
          pcVar7 = "cannot find more CoAP option";
          local_68.context_.types_ = local_68.types_;
          do {
            pcVar6 = pcVar7 + 1;
            if (*pcVar7 == '}') {
              if ((pcVar6 == "") || (*pcVar6 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar6 = pcVar7 + 2;
            }
            else if (*pcVar7 == '{') {
              pcVar6 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar7,"",&local_68);
            }
            pcVar7 = pcVar6;
          } while (pcVar6 != "");
          args_01.field_1.values_ = aVar14.values_;
          args_01.desc_ = (unsigned_long_long)&local_68;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_c0,(v10 *)"cannot find more CoAP option",(string_view)ZEXT816(0x1c),
                     args_01);
          local_98[0] = kNotFound;
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,local_c0._M_dataplus._M_p,
                     local_c0._M_dataplus._M_p + local_c0._M_string_length);
          goto LAB_001f4063;
        }
        local_68.types_[0] = uint_type;
        pcVar7 = "invalid CoAP option (firstByte={:X})";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "invalid CoAP option (firstByte={:X})";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
        local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_68.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
        local_a0.handler_ = &local_68;
        local_68.context_.types_ = local_68.types_;
        do {
          cVar2 = *pcVar7;
          pcVar6 = pcVar7;
          while (cVar2 != '{') {
            pcVar6 = pcVar6 + 1;
            if (pcVar6 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
              ::writer::operator()(&local_a0,pcVar7,"");
              goto LAB_001f4551;
            }
            cVar2 = *pcVar6;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
          ::writer::operator()(&local_a0,pcVar7,pcVar6);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                             (pcVar6,"",&local_68);
        } while (pcVar7 != "");
LAB_001f4551:
        local_68._0_8_ =
             ZEXT18(*(byte *)((long)&pvVar3->field_0 +
                             (long)(aBuf->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_start));
        fmt_00.size_ = 2;
        fmt_00.data_ = (char *)0x24;
        args_04.field_1.values_ = aVar14.values_;
        args_04.desc_ = (unsigned_long_long)&local_68;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_c0,(v10 *)"invalid CoAP option (firstByte={:X})",fmt_00,args_04);
        local_98[0] = kBadFormat;
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
LAB_001f45a6:
        __return_storage_ptr__->mCode = local_98[0];
        goto LAB_001f406d;
      }
      pvVar15 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                ((long)&pvVar3->field_0 + 1);
LAB_001f40eb:
      if (0xc < bVar12) {
        if (bVar12 == 0xe) {
          uVar13 = *(ushort *)((long)&pvVar15->field_0 + (long)puVar4);
          uVar13 = (uVar13 << 8 | uVar13 >> 8) + 0x10d;
          pvVar15 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                    ((long)&pvVar15->field_0 + 2);
        }
        else {
          if (uVar13 != 0xd) {
            local_68.types_[0] = uint_type;
            pcVar7 = "invalid CoAP option (firstByte={:X})";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "invalid CoAP option (firstByte={:X})";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
            local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
            local_68.parse_funcs_[0] =
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
            local_a0.handler_ = &local_68;
            local_68.context_.types_ = local_68.types_;
            do {
              cVar2 = *pcVar7;
              pcVar6 = pcVar7;
              while (cVar2 != '{') {
                pcVar6 = pcVar6 + 1;
                if (pcVar6 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
                  ::writer::operator()(&local_a0,pcVar7,"");
                  goto LAB_001f444e;
                }
                cVar2 = *pcVar6;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
              ::writer::operator()(&local_a0,pcVar7,pcVar6);
              pcVar7 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                                 (pcVar6,"",&local_68);
            } while (pcVar7 != "");
LAB_001f444e:
            local_68._0_8_ =
                 ZEXT18(*(byte *)((long)&pvVar3->field_0 +
                                 (long)(aBuf->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
            fmt.size_ = 2;
            fmt.data_ = (char *)0x24;
            args_03.field_1.values_ = aVar14.values_;
            args_03.desc_ = (unsigned_long_long)&local_68;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_c0,(v10 *)"invalid CoAP option (firstByte={:X})",fmt,args_03);
            local_98[0] = kBadFormat;
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,local_c0._M_dataplus._M_p,
                       local_c0._M_dataplus._M_p + local_c0._M_string_length);
            goto LAB_001f45a6;
          }
          paVar5 = &pvVar15->field_0;
          pvVar15 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                    ((long)&pvVar15->field_0 + 1);
          uVar13 = *(byte *)((long)paVar5 + (long)puVar4) + 0xd;
        }
      }
      if (aVar14.values_ != pvVar15) {
        abort();
      }
      local_38 = (ulong)uVar13;
      if ((value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
          ((long)&(aVar14.values_)->field_0 + local_38) <= pvVar9) {
        *aOptionNumber = uVar11 + aLastOptionNumber;
        __first._M_current = (uchar *)((long)&(aVar14.values_)->field_0 + (long)puVar4);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,__first,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(__first._M_current + local_38),(allocator_type *)local_98);
        uVar17 = (long)local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ -
                 local_68._0_8_;
        if (uVar17 == 0) {
          __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
          __n = 0;
        }
        else {
          if ((long)uVar17 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(uVar17);
          __n = (long)local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ -
                local_68._0_8_;
        }
        pcVar7 = (char *)local_68._0_8_;
        paVar8 = __dest;
        if (local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ !=
            (char *)local_68._0_8_) {
          local_70 = __dest;
          memmove(__dest,(void *)local_68._0_8_,__n);
          paVar8 = local_70;
        }
        puVar4 = (aOptionValue->mValue).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (aOptionValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)paVar8;
        (aOptionValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(paVar8->_M_local_buf + __n);
        (aOptionValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(__dest->_M_local_buf + uVar17)
        ;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
          pcVar7 = (char *)local_68._0_8_;
        }
        if (pcVar7 != (char *)0x0) {
          operator_delete(pcVar7);
        }
        *aOffset = *aOffset + local_38 + lVar10 + lVar16;
        return __return_storage_ptr__;
      }
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of a CoAP option";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      pcVar7 = "premature end of a CoAP option";
      local_68.context_.types_ = local_68.types_;
      do {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",&local_68);
        }
        pcVar7 = pcVar6;
      } while (pcVar6 != "");
      args_02.field_1.values_ = aVar14.values_;
      args_02.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),
                 args_02);
      local_98[0] = kBadFormat;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
    }
  }
  else {
    local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of a CoAP option";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar7 = "premature end of a CoAP option";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",&local_68);
      }
      pcVar7 = pcVar6;
    } while (pcVar6 != "");
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aOffset;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),args_00)
    ;
    local_98[0] = kBadFormat;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
  }
LAB_001f4063:
  __return_storage_ptr__->mCode = local_98[0];
LAB_001f406d:
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Deserialize(OptionType      &aOptionNumber,
                           OptionValue     &aOptionValue,
                           uint16_t         aLastOptionNumber,
                           const ByteArray &aBuf,
                           size_t          &aOffset)
{
    Error    error;
    uint16_t delta;
    uint16_t length;
    uint16_t valueLength;
    size_t   firstByte = aOffset;
    size_t   extend    = aOffset + 1;

    VerifyOrExit(firstByte < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    delta       = aBuf[firstByte] >> 4;
    valueLength = aBuf[firstByte] & 0x0f;

    length = 1;
    length += delta < kOption1ByteExtension ? 0 : (delta < kOption2ByteExtension ? 1 : 2);
    length += valueLength < kOption1ByteExtension ? 0 : (valueLength < kOption2ByteExtension ? 1 : 2);

    VerifyOrExit(firstByte + length <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    if (delta < kOption1ByteExtension)
    {
        // do nothing
    }
    else if (delta == kOption1ByteExtension)
    {
        delta = kOption1ByteExtensionOffset + aBuf[extend++];
    }
    else if (delta == kOption2ByteExtension)
    {
        delta = kOption2ByteExtensionOffset + ((static_cast<uint16_t>(aBuf[extend]) << 8) | aBuf[extend + 1]);
        extend += 2;
    }
    else
    {
        // we have delta == 0x0f

        VerifyOrExit(valueLength == 0x0f,
                     error = ERROR_BAD_FORMAT("invalid CoAP option (firstByte={:X})", aBuf[firstByte]));
        ExitNow(error = ERROR_NOT_FOUND("cannot find more CoAP option"));
    }

    if (valueLength < kOption1ByteExtension)
    {
        // do nothing
    }
    else if (valueLength == kOption1ByteExtension)
    {
        valueLength = kOption1ByteExtensionOffset + aBuf[extend++];
    }
    else if (valueLength == kOption2ByteExtension)
    {
        valueLength = kOption2ByteExtensionOffset + ((static_cast<uint16_t>(aBuf[extend]) << 8) | aBuf[extend + 1]);
        extend += 2;
    }
    else
    {
        ExitNow(error = ERROR_BAD_FORMAT("invalid CoAP option (firstByte={:X})", aBuf[firstByte]));
    }

    VerifyOrDie(firstByte + length == extend);

    VerifyOrExit(valueLength + extend <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    aOptionNumber = utils::from_underlying<OptionType>(aLastOptionNumber + delta);
    aOptionValue  = OptionValue{ByteArray{aBuf.begin() + extend, aBuf.begin() + extend + valueLength}};

    aOffset += length + valueLength;

exit:
    return error;
}